

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O0

void __thiscall Centaurus::Grammar<char>::print_ldfa(Grammar<char> *this,wostream *os,ATNPath *path)

{
  CompositeATN<char> *this_00;
  Identifier *this_01;
  wstring *graph_name;
  undefined1 local_88 [8];
  LookaheadDFA<char> ldfa;
  CompositeATN<char> catn;
  ATNPath *path_local;
  wostream *os_local;
  Grammar<char> *this_local;
  
  this_00 = (CompositeATN<char> *)
            &ldfa.super_NFABase<Centaurus::LDFAState<char>_>.m_states.
             super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  CompositeATN<char>::CompositeATN(this_00,this);
  LookaheadDFA<char>::LookaheadDFA((LookaheadDFA<char> *)local_88,this_00,path,true);
  this_01 = ATNPath::leaf_id(path);
  graph_name = Identifier::str_abi_cxx11_(this_01);
  LookaheadDFA<char>::print((LookaheadDFA<char> *)local_88,os,graph_name);
  LookaheadDFA<char>::~LookaheadDFA((LookaheadDFA<char> *)local_88);
  CompositeATN<char>::~CompositeATN
            ((CompositeATN<char> *)
             &ldfa.super_NFABase<Centaurus::LDFAState<char>_>.m_states.
              super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Grammar<TCHAR>::print_ldfa(std::wostream& os, const ATNPath& path) const
{
    CompositeATN<TCHAR> catn(*this);

    LookaheadDFA<TCHAR> ldfa(catn, path);

    ldfa.print(os, path.leaf_id().str());
}